

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegmentMerge(Fts3Table *p,int iLangid,int iIndex,int iLevel)

{
  uint uVar1;
  bool local_b9;
  SegmentWriter *local_b8;
  i64 iMaxLevel;
  undefined1 auStack_a8 [4];
  int bIgnoreEmpty;
  Fts3MultiSegReader csr;
  Fts3SegFilter filter;
  SegmentWriter *pWriter;
  sqlite3_int64 iNewLevel;
  int local_20;
  int iIdx;
  int rc;
  int iLevel_local;
  int iIndex_local;
  int iLangid_local;
  Fts3Table *p_local;
  
  iNewLevel._4_4_ = 0;
  filter.flags = 0;
  filter._20_4_ = 0;
  iMaxLevel._4_4_ = 0;
  local_b8 = (SegmentWriter *)0x0;
  iIdx = iLevel;
  rc = iIndex;
  iLevel_local = iLangid;
  _iIndex_local = p;
  local_20 = sqlite3Fts3SegReaderCursor
                       (p,iLangid,iIndex,iLevel,(char *)0x0,0,1,0,(Fts3MultiSegReader *)auStack_a8);
  if (((local_20 == 0) && ((int)csr.apSegment != 0)) &&
     ((iIdx == -1 ||
      (local_20 = fts3SegmentMaxLevel(_iIndex_local,iLevel_local,rc,(sqlite3_int64 *)&local_b8),
      local_20 == 0)))) {
    if (iIdx == -2) {
      if (((int)csr.apSegment == 1) && ((*_auStack_a8)->ppNextElem == (Fts3HashElem **)0x0)) {
        local_20 = 0x65;
        goto LAB_002051b3;
      }
      pWriter = local_b8;
      iMaxLevel._4_4_ = 1;
    }
    else {
      pWriter = (SegmentWriter *)getAbsoluteLevel(_iIndex_local,iLevel_local,rc,iIdx + 1);
      local_20 = fts3AllocateSegdirIdx
                           (_iIndex_local,iLevel_local,rc,iIdx + 1,(int *)((long)&iNewLevel + 4));
      local_b9 = iIdx != -1 && (long)local_b8 < (long)pWriter;
      iMaxLevel._4_4_ = (uint)local_b9;
    }
    if (local_20 == 0) {
      memset(&csr.nDoclist,0,0x18);
      uVar1 = 0;
      if (iMaxLevel._4_4_ != 0) {
        uVar1 = 2;
      }
      filter.nTerm = uVar1 | 1;
      local_20 = sqlite3Fts3SegReaderStart
                           (_iIndex_local,(Fts3MultiSegReader *)auStack_a8,
                            (Fts3SegFilter *)&csr.nDoclist);
      while ((local_20 == 0 &&
             (local_20 = sqlite3Fts3SegReaderStep(_iIndex_local,(Fts3MultiSegReader *)auStack_a8),
             local_20 == 100))) {
        local_20 = fts3SegWriterAdd(_iIndex_local,(SegmentWriter **)&filter.flags,1,
                                    (char *)csr._48_8_,(int)csr.zTerm,(char *)csr._64_8_,
                                    (int)csr.aDoclist);
      }
      if ((((local_20 == 0) &&
           (((iIdx == -1 ||
             (local_20 = fts3DeleteSegdir(_iIndex_local,iLevel_local,rc,iIdx,_auStack_a8,
                                          (int)csr.apSegment), local_20 == 0)) &&
            (filter._16_8_ != 0)))) &&
          (local_20 = fts3SegWriterFlush(_iIndex_local,(SegmentWriter *)filter._16_8_,
                                         (sqlite3_int64)pWriter,iNewLevel._4_4_), local_20 == 0)) &&
         ((iIdx == -1 || ((long)pWriter < (long)local_b8)))) {
        local_20 = fts3PromoteSegments(_iIndex_local,(sqlite3_int64)pWriter,
                                       *(sqlite3_int64 *)(filter._16_8_ + 0x40));
      }
    }
  }
LAB_002051b3:
  fts3SegWriterFree((SegmentWriter *)filter._16_8_);
  sqlite3Fts3SegReaderFinish((Fts3MultiSegReader *)auStack_a8);
  return local_20;
}

Assistant:

static int fts3SegmentMerge(
  Fts3Table *p, 
  int iLangid,                    /* Language id to merge */
  int iIndex,                     /* Index in p->aIndex[] to merge */
  int iLevel                      /* Level to merge */
){
  int rc;                         /* Return code */
  int iIdx = 0;                   /* Index of new segment */
  sqlite3_int64 iNewLevel = 0;    /* Level/index to create new segment at */
  SegmentWriter *pWriter = 0;     /* Used to write the new, merged, segment */
  Fts3SegFilter filter;           /* Segment term filter condition */
  Fts3MultiSegReader csr;         /* Cursor to iterate through level(s) */
  int bIgnoreEmpty = 0;           /* True to ignore empty segments */
  i64 iMaxLevel = 0;              /* Max level number for this index/langid */

  assert( iLevel==FTS3_SEGCURSOR_ALL
       || iLevel==FTS3_SEGCURSOR_PENDING
       || iLevel>=0
  );
  assert( iLevel<FTS3_SEGDIR_MAXLEVEL );
  assert( iIndex>=0 && iIndex<p->nIndex );

  rc = sqlite3Fts3SegReaderCursor(p, iLangid, iIndex, iLevel, 0, 0, 1, 0, &csr);
  if( rc!=SQLITE_OK || csr.nSegment==0 ) goto finished;

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    rc = fts3SegmentMaxLevel(p, iLangid, iIndex, &iMaxLevel);
    if( rc!=SQLITE_OK ) goto finished;
  }

  if( iLevel==FTS3_SEGCURSOR_ALL ){
    /* This call is to merge all segments in the database to a single
    ** segment. The level of the new segment is equal to the numerically
    ** greatest segment level currently present in the database for this
    ** index. The idx of the new segment is always 0.  */
    if( csr.nSegment==1 && 0==fts3SegReaderIsPending(csr.apSegment[0]) ){
      rc = SQLITE_DONE;
      goto finished;
    }
    iNewLevel = iMaxLevel;
    bIgnoreEmpty = 1;

  }else{
    /* This call is to merge all segments at level iLevel. find the next
    ** available segment index at level iLevel+1. The call to
    ** fts3AllocateSegdirIdx() will merge the segments at level iLevel+1 to 
    ** a single iLevel+2 segment if necessary.  */
    assert( FTS3_SEGCURSOR_PENDING==-1 );
    iNewLevel = getAbsoluteLevel(p, iLangid, iIndex, iLevel+1);
    rc = fts3AllocateSegdirIdx(p, iLangid, iIndex, iLevel+1, &iIdx);
    bIgnoreEmpty = (iLevel!=FTS3_SEGCURSOR_PENDING) && (iNewLevel>iMaxLevel);
  }
  if( rc!=SQLITE_OK ) goto finished;

  assert( csr.nSegment>0 );
  assert_fts3_nc( iNewLevel>=getAbsoluteLevel(p, iLangid, iIndex, 0) );
  assert_fts3_nc( 
    iNewLevel<getAbsoluteLevel(p, iLangid, iIndex,FTS3_SEGDIR_MAXLEVEL) 
  );

  memset(&filter, 0, sizeof(Fts3SegFilter));
  filter.flags = FTS3_SEGMENT_REQUIRE_POS;
  filter.flags |= (bIgnoreEmpty ? FTS3_SEGMENT_IGNORE_EMPTY : 0);

  rc = sqlite3Fts3SegReaderStart(p, &csr, &filter);
  while( SQLITE_OK==rc ){
    rc = sqlite3Fts3SegReaderStep(p, &csr);
    if( rc!=SQLITE_ROW ) break;
    rc = fts3SegWriterAdd(p, &pWriter, 1, 
        csr.zTerm, csr.nTerm, csr.aDoclist, csr.nDoclist);
  }
  if( rc!=SQLITE_OK ) goto finished;
  assert( pWriter || bIgnoreEmpty );

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    rc = fts3DeleteSegdir(
        p, iLangid, iIndex, iLevel, csr.apSegment, csr.nSegment
    );
    if( rc!=SQLITE_OK ) goto finished;
  }
  if( pWriter ){
    rc = fts3SegWriterFlush(p, pWriter, iNewLevel, iIdx);
    if( rc==SQLITE_OK ){
      if( iLevel==FTS3_SEGCURSOR_PENDING || iNewLevel<iMaxLevel ){
        rc = fts3PromoteSegments(p, iNewLevel, pWriter->nLeafData);
      }
    }
  }

 finished:
  fts3SegWriterFree(pWriter);
  sqlite3Fts3SegReaderFinish(&csr);
  return rc;
}